

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<32,151>::
GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeRMatrixLimitedBlock,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited>
::GeneralCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeRMatrixLimitedBlock,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited>
           *this,ControlRecord *cont,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined8 *puVar1;
  optional<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties> local_60;
  
  if (*(long *)&(cont->
                super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long> == 0) {
    local_60.
    super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
    ._M_payload.
    super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
    .
    super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
    ._M_engaged = false;
    GeneralCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (this,(cont->
                    super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                    ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Head_base<0UL,_double,_false>._M_head_impl,
               (cont->
               super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
               ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Head_base<1UL,_double,_false>._M_head_impl,&local_60,
               (uint)((_Head_base<4UL,_long,_false> *)
                     ((long)&(cont->
                             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                             ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>
                             .super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                             super__Tuple_impl<2UL,_long,_long,_long,_long>.
                             super__Tuple_impl<3UL,_long,_long,_long>.
                             super__Tuple_impl<4UL,_long,_long> + 8))->_M_head_impl,it,end,
               lineNumber,MAT,MF,MT);
    if (local_60.
        super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
        ._M_payload.
        super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
        .
        super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
        ._M_engaged == true) {
      local_60.
      super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
      ._M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
      .
      super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
      ._M_engaged = false;
      if (local_60.
          super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
          ._M_payload.
          super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
          .
          super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
          ._M_payload._M_value.super_ListRecord.data.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.
                        super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
                        ._M_payload.
                        super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
                        .
                        super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
                        ._M_payload._M_value.super_ListRecord.data.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
                              ._M_payload.
                              super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
                              .
                              super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
                              ._M_payload._M_value.super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        local_60.
                        super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
                        ._M_payload.
                        super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
                        .
                        super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
                        ._M_payload._48_8_);
      }
    }
    return;
  }
  tools::Log::error<char_const*>
            (
            "Scattering radius uncertainties in the R-matrix limited representation are not supported yet."
            );
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

GeneralCovarianceBase( ControlRecord&& cont,
                       Iterator& it, const Iterator& end, long& lineNumber,
                       int MAT, int MF, int MT ) :
  // no try ... catch: exceptions will be handled in the derived class
  GeneralCovarianceBase( cont.C1(), cont.C2(),
                         cont.N2()
                           ? std::make_optional(
                                    Derived::read( it, end, lineNumber,
                                                   MAT, MF, MT ) )
                           : std::nullopt,
                         cont.N1(),
                         it, end, lineNumber, MAT, MF, MT ) {}